

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O0

void Decode4Base64ToBytes(char *FourCharBlock,uint8_t *ThreeByteBlock)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 local_1c [4];
  byte *pbStack_18;
  uint8_t sixBitValues [4];
  uint8_t *ThreeByteBlock_local;
  char *FourCharBlock_local;
  
  pbStack_18 = ThreeByteBlock;
  memset(local_1c,0,4);
  bVar1 = ""[(int)((int)FourCharBlock[1] & 0x7f)];
  bVar2 = ""[(int)((int)FourCharBlock[2] & 0x7f)];
  bVar3 = ""[(int)((int)FourCharBlock[3] & 0x7f)];
  *pbStack_18 = ""[(int)((int)*FourCharBlock & 0x7f)] << 2 | (byte)((int)(uint)bVar1 >> 4);
  pbStack_18[1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
  pbStack_18[2] = bVar2 << 6 | bVar3;
  return;
}

Assistant:

void
    Decode4Base64ToBytes
    (
        char const*         FourCharBlock,          // [in]
        uint8_t*            ThreeByteBlock          // [out]
    )
{
    // Convert the characters into 6 bit values
    uint8_t sixBitValues [4] = {0};

    sixBitValues[0] = BASE64INVERT[ FourCharBlock[0] & 0x7f ];
    sixBitValues[1] = BASE64INVERT[ FourCharBlock[1] & 0x7f ];
    sixBitValues[2] = BASE64INVERT[ FourCharBlock[2] & 0x7f ];
    sixBitValues[3] = BASE64INVERT[ FourCharBlock[3] & 0x7f ];

    // Assemble the 6 bit values into three bytes.
    ThreeByteBlock[0] = ( sixBitValues[0] << 2 ) | ( sixBitValues[1] >> 4 );
    ThreeByteBlock[1] = ( sixBitValues[1] << 4 ) | ( sixBitValues[2] >> 2 );
    ThreeByteBlock[2] = ( sixBitValues[2] << 6 ) | ( sixBitValues[3] );
}